

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

TypeCast * __thiscall soul::heart::Parser::parseCast(Parser *this,FunctionParseState *state)

{
  Expression *args_1;
  Module *this_00;
  TypeCast *pTVar1;
  CodeLocation pos;
  Type destType;
  CodeLocation local_38;
  Type local_28;
  
  local_38.sourceCode.object =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.sourceCode.object;
  if (local_38.sourceCode.object != (SourceCodeText *)0x0) {
    ((local_38.sourceCode.object)->super_RefCountedObject).refCount =
         ((local_38.sourceCode.object)->super_RefCountedObject).refCount + 1;
  }
  local_38.location.data =
       (this->
       super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
       ).location.location.data;
  readValueType(&local_28,this);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x29b537);
  args_1 = parseExpression(this,state);
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x299119);
  this_00 = pool_ptr<soul::Module>::operator->(&this->module);
  pTVar1 = Module::
           allocate<soul::heart::TypeCast,soul::CodeLocation&,soul::heart::Expression&,soul::Type&>
                     (this_00,&local_38,args_1,&local_28);
  RefCountedPtr<soul::Structure>::~RefCountedPtr(&local_28.structure);
  RefCountedPtr<soul::SourceCodeText>::~RefCountedPtr(&local_38.sourceCode);
  return pTVar1;
}

Assistant:

heart::TypeCast& parseCast (const FunctionParseState& state)
    {
        auto pos = location;
        auto destType = readValueType();
        expect (HEARTOperator::openParen);
        auto& source = parseExpression (state);
        expect (HEARTOperator::closeParen);

        return module->allocate<heart::TypeCast> (pos, source, destType);
    }